

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::CmdLine::declare_arg
               (string *name,ArgType type,string *default_value,string *description,ArgFlags flags)

{
  bool bVar1;
  mapped_type *this;
  Environment *pEVar2;
  ostream *poVar3;
  pointer ppVar4;
  allocator local_111;
  string local_110 [32];
  _Self local_f0;
  _Self local_e8;
  iterator it;
  string group;
  undefined1 local_c0 [8];
  Arg arg;
  allocator local_61;
  string local_60 [32];
  _Self local_40;
  _Self local_38;
  ArgFlags local_2c;
  string *psStack_28;
  ArgFlags flags_local;
  string *description_local;
  string *default_value_local;
  string *psStack_10;
  ArgType type_local;
  string *name_local;
  
  local_2c = flags;
  psStack_28 = description;
  description_local = default_value;
  default_value_local._4_4_ = type;
  psStack_10 = name;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
               *)(::(anonymous_namespace)::desc_ + 0x20),name);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
              *)(::(anonymous_namespace)::desc_ + 0x20));
  bVar1 = std::operator!=(&local_38,&local_40);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"CmdLine",&local_61);
    poVar3 = Logger::err((string *)local_60);
    poVar3 = std::operator<<(poVar3,"Argument is multiply defined: ");
    poVar3 = std::operator<<(poVar3,(string *)psStack_10);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    anon_unknown.dwarf_5292d::Arg::Arg((Arg *)local_c0);
    std::__cxx11::string::operator=((string *)local_c0,(string *)psStack_10);
    arg._56_4_ = default_value_local._4_4_;
    std::__cxx11::string::operator=((string *)&arg.field_0x18,(string *)psStack_28);
    arg._60_4_ = local_2c;
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                         *)(::(anonymous_namespace)::desc_ + 0x20),psStack_10);
    anon_unknown.dwarf_5292d::Arg::operator=(this,(Arg *)local_c0);
    pEVar2 = Environment::instance();
    (*(pEVar2->super_Counted)._vptr_Counted[4])(pEVar2,psStack_10,description_local);
    anon_unknown.dwarf_5292d::arg_group((anon_unknown_dwarf_5292d *)&it,psStack_10);
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>_>
                 *)(::(anonymous_namespace)::desc_ + 0x50),(key_type *)&it);
    local_f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>_>
                *)(::(anonymous_namespace)::desc_ + 0x50));
    bVar1 = std::operator==(&local_e8,&local_f0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"CmdLine",&local_111);
      poVar3 = Logger::err((string *)local_110);
      poVar3 = std::operator<<(poVar3,"Argument group does not exist: ");
      poVar3 = std::operator<<(poVar3,(string *)psStack_10);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    else {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>
               ::operator->(&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(ppVar4->second).args,psStack_10);
    }
    std::__cxx11::string::~string((string *)&it);
    anon_unknown.dwarf_5292d::Arg::~Arg((Arg *)local_c0);
  }
  return;
}

Assistant:

void declare_arg(
            const std::string& name,
            ArgType type,
            const std::string& default_value,
            const std::string& description,
            ArgFlags flags
        ) {
            if(desc_->args.find(name) != desc_->args.end()) {
                Logger::err("CmdLine")
                    << "Argument is multiply defined: " << name
                    << std::endl;
                return;
            }

            Arg arg;
            arg.name = name;
            arg.type = type;
            arg.desc = description;
            arg.flags = flags;
            desc_->args[name] = arg;

            Environment::instance()->set_value(name, default_value);

            std::string group = arg_group(name);
            auto it = desc_->groups.find(group);
            if(it == desc_->groups.end()) {
                Logger::err("CmdLine")
                    << "Argument group does not exist: " << name
                    << std::endl;
                return;
            }

            it->second.args.push_back(name);
        }